

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O2

void llama_sampler_dry_free(llama_sampler *smpl)

{
  llama_sampler_dry *this;
  
  this = (llama_sampler_dry *)smpl->ctx;
  if (this != (llama_sampler_dry *)0x0) {
    llama_sampler_dry::~llama_sampler_dry(this);
  }
  operator_delete(this,0xd8);
  return;
}

Assistant:

static void llama_sampler_dry_free(struct llama_sampler * smpl) {
    delete (llama_sampler_dry *) smpl->ctx;
}